

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

NeuralNetwork *
buildBasicNeuralNetworkModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr,
          int numberOfLayers,bool areWeightsQuantized,bool isBiasQuantized)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<float> *pRVar2;
  Rep *pRVar3;
  bool bVar4;
  RepeatedPtrFieldBase *this;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ModelDescription *pMVar8;
  FeatureType *pFVar9;
  long *plVar10;
  void *pvVar11;
  ArrayFeatureType *pAVar12;
  NeuralNetworkLayer *pNVar13;
  TensorAttributes *pTVar14;
  LayerUnion LVar15;
  WeightParams *pWVar16;
  QuantizationParams *pQVar17;
  float *pfVar18;
  LinearQuantizationParams *pLVar19;
  FeatureDescription *pFVar20;
  long *plVar21;
  ulong uVar22;
  undefined8 *puVar23;
  ArenaStringPtr *pAVar24;
  Arena *pAVar25;
  undefined4 in_register_00000084;
  undefined3 in_register_00000089;
  uint uVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  void **ppvVar32;
  string input;
  string output;
  string layerName;
  string __str_1;
  TensorAttributes local_f0;
  long local_e0;
  long lStack_d8;
  TensorAttributes local_d0;
  long local_c0;
  long lStack_b8;
  undefined8 local_b0;
  TensorAttributes *local_a8;
  TensorAttributes *local_a0;
  FeatureDescription local_98;
  uint local_68;
  undefined4 local_64;
  NeuralNetwork *local_60;
  long *local_58 [2];
  long local_48 [2];
  RepeatedPtrFieldBase *local_38;
  
  local_64 = CONCAT31(in_register_00000089,areWeightsQuantized);
  local_b0 = CONCAT44(in_register_00000084,numberOfLayers);
  pMVar8 = m->description_;
  local_a8 = outTensorAttr;
  local_a0 = inTensorAttr;
  if (pMVar8 == (ModelDescription *)0x0) {
    uVar22 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
    if ((uVar22 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pMVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar25);
    m->description_ = pMVar8;
  }
  pRVar3 = (pMVar8->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001dcddc:
    pFVar20 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar8->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar8->input_).super_RepeatedPtrFieldBase,pFVar20);
  }
  else {
    iVar30 = (pMVar8->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar30) goto LAB_001dcddc;
    (pMVar8->input_).super_RepeatedPtrFieldBase.current_size_ = iVar30 + 1;
    pvVar11 = pRVar3->elements[iVar30];
  }
  puVar23 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar23 = (undefined8 *)*puVar23;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),local_a0->name,puVar23);
  pFVar9 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar9 == (FeatureType *)0x0) {
    pAVar25 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar25);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar9;
  }
  if (pFVar9->_oneof_case_[0] == 5) {
    pAVar12 = (pFVar9->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar22 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
    if ((uVar22 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pAVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar25);
    (pFVar9->Type_).multiarraytype_ = pAVar12;
  }
  pAVar12->datatype_ = 0x10020;
  if (0 < local_a0->dimension) {
    pRVar1 = &pAVar12->shape_;
    uVar7 = (pAVar12->shape_).current_size_;
    iVar30 = 0;
    do {
      if (uVar7 == (pAVar12->shape_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar7 + 1);
        plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar10[uVar7] = 1;
      }
      else {
        plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar10[uVar7] = 1;
      }
      uVar7 = uVar7 + 1;
      pRVar1->current_size_ = uVar7;
      iVar30 = iVar30 + 1;
    } while (iVar30 < local_a0->dimension);
  }
  pMVar8 = m->description_;
  if (pMVar8 == (ModelDescription *)0x0) {
    uVar22 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
    if ((uVar22 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pMVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar25);
    m->description_ = pMVar8;
  }
  pRVar3 = (pMVar8->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar30 = (pMVar8->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar30 < pRVar3->allocated_size) {
      (pMVar8->output_).super_RepeatedPtrFieldBase.current_size_ = iVar30 + 1;
      pvVar11 = pRVar3->elements[iVar30];
      goto LAB_001dcf5e;
    }
  }
  pFVar20 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                      ((pMVar8->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pMVar8->output_).super_RepeatedPtrFieldBase,pFVar20);
LAB_001dcf5e:
  puVar23 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar23 = (undefined8 *)*puVar23;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),local_a8->name,puVar23);
  pFVar9 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar9 == (FeatureType *)0x0) {
    pAVar25 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar25);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar9;
  }
  if (pFVar9->_oneof_case_[0] == 5) {
    pAVar12 = (pFVar9->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar22 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
    if ((uVar22 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pAVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar25);
    (pFVar9->Type_).multiarraytype_ = pAVar12;
  }
  pAVar12->datatype_ = 0x10020;
  if (0 < local_a8->dimension) {
    pRVar1 = &pAVar12->shape_;
    uVar7 = (pAVar12->shape_).current_size_;
    iVar30 = 0;
    do {
      if (uVar7 == (pAVar12->shape_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar7 + 1);
        plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar10[uVar7] = 1;
      }
      else {
        plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar10[uVar7] = 1;
      }
      uVar7 = uVar7 + 1;
      pRVar1->current_size_ = uVar7;
      iVar30 = iVar30 + 1;
    } while (iVar30 < local_a8->dimension);
  }
  m->specificationversion_ = 4;
  if (m->_oneof_case_[0] == 500) {
    local_60 = (NeuralNetwork *)(m->Type_).pipeline_;
  }
  else {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 500;
    uVar22 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
    if ((uVar22 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    local_60 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                         (pAVar25);
    (m->Type_).neuralnetwork_ = local_60;
  }
  if (0 < (int)(uint)local_b0) {
    local_38 = &(local_60->layers_).super_RepeatedPtrFieldBase;
    local_68 = (uint)local_b0 - 1;
    uVar7 = 0;
    do {
      this = local_38;
      pRVar3 = (local_60->layers_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar3 == (Rep *)0x0) {
LAB_001dd0f9:
        pNVar13 = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>(local_38->arena_);
        pNVar13 = (NeuralNetworkLayer *)
                  google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this,pNVar13)
        ;
      }
      else {
        iVar30 = (local_60->layers_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar3->allocated_size <= iVar30) goto LAB_001dd0f9;
        (local_60->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar30 + 1;
        pNVar13 = (NeuralNetworkLayer *)pRVar3->elements[iVar30];
      }
      uVar29 = 1;
      if (9 < uVar7) {
        uVar31 = 4;
        uVar26 = uVar7;
        do {
          uVar29 = uVar31;
          if (uVar26 < 100) {
            uVar29 = uVar29 - 2;
            goto LAB_001dd174;
          }
          if (uVar26 < 1000) {
            uVar29 = uVar29 - 1;
            goto LAB_001dd174;
          }
          if (uVar26 < 10000) goto LAB_001dd174;
          bVar4 = 99999 < uVar26;
          uVar31 = uVar29 + 4;
          uVar26 = uVar26 / 10000;
        } while (bVar4);
        uVar29 = uVar29 + 1;
      }
LAB_001dd174:
      local_f0.name = (char *)&local_e0;
      std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar29);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_f0.name,uVar29,uVar7);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x398ae9);
      local_98.super_MessageLite._vptr_MessageLite = (_func_int **)&local_98.name_;
      plVar21 = plVar10 + 2;
      if ((ArenaStringPtr *)*plVar10 == (ArenaStringPtr *)plVar21) {
        local_98.name_.tagged_ptr_.ptr_ =
             (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )*plVar21;
        local_98.shortdescription_.tagged_ptr_.ptr_ =
             (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )plVar10[3];
      }
      else {
        local_98.name_.tagged_ptr_.ptr_ =
             (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )*plVar21;
        local_98.super_MessageLite._vptr_MessageLite = (_func_int **)*plVar10;
      }
      local_98.super_MessageLite._internal_metadata_.ptr_ = plVar10[1];
      *plVar10 = (long)plVar21;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((long *)local_f0.name != &local_e0) {
        operator_delete(local_f0.name,local_e0 + 1);
      }
      uVar26 = uVar7 - 1;
      uVar29 = -uVar26;
      if (0 < (int)uVar26) {
        uVar29 = uVar26;
      }
      uVar31 = 1;
      local_d0.name = (char *)&local_c0;
      if (9 < uVar29) {
        uVar22 = (ulong)uVar29;
        uVar5 = 4;
        do {
          uVar31 = uVar5;
          uVar6 = (uint)uVar22;
          if (uVar6 < 100) {
            uVar31 = uVar31 - 2;
            goto LAB_001dd29c;
          }
          if (uVar6 < 1000) {
            uVar31 = uVar31 - 1;
            goto LAB_001dd29c;
          }
          if (uVar6 < 10000) goto LAB_001dd29c;
          uVar22 = uVar22 / 10000;
          uVar5 = uVar31 + 4;
        } while (99999 < uVar6);
        uVar31 = uVar31 + 1;
      }
LAB_001dd29c:
      std::__cxx11::string::_M_construct
                ((ulong)&local_d0,(char)uVar31 - (char)((int)uVar26 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_d0.name + (ulong)(uVar26 >> 0x1f)),uVar31,uVar29);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x3bbdaf);
      local_f0.name = (char *)&local_e0;
      plVar21 = plVar10 + 2;
      if ((long *)*plVar10 == plVar21) {
        local_e0 = *plVar21;
        lStack_d8 = plVar10[3];
      }
      else {
        local_e0 = *plVar21;
        local_f0.name = (char *)*plVar10;
      }
      local_f0._8_8_ = plVar10[1];
      *plVar10 = (long)plVar21;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((long *)local_d0.name != &local_c0) {
        operator_delete(local_d0.name,local_c0 + 1);
      }
      uVar29 = 1;
      if (9 < uVar7) {
        uVar26 = 4;
        uVar31 = uVar7;
        do {
          uVar29 = uVar26;
          if (uVar31 < 100) {
            uVar29 = uVar29 - 2;
            goto LAB_001dd3a7;
          }
          if (uVar31 < 1000) {
            uVar29 = uVar29 - 1;
            goto LAB_001dd3a7;
          }
          if (uVar31 < 10000) goto LAB_001dd3a7;
          bVar4 = 99999 < uVar31;
          uVar26 = uVar29 + 4;
          uVar31 = uVar31 / 10000;
        } while (bVar4);
        uVar29 = uVar29 + 1;
      }
LAB_001dd3a7:
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar29);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_58[0],uVar29,uVar7);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x3bbdaf);
      local_d0.name = (char *)&local_c0;
      plVar21 = plVar10 + 2;
      if ((long *)*plVar10 == plVar21) {
        local_c0 = *plVar21;
        lStack_b8 = plVar10[3];
      }
      else {
        local_c0 = *plVar21;
        local_d0.name = (char *)*plVar10;
      }
      local_d0._8_8_ = plVar10[1];
      *plVar10 = (long)plVar21;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pAVar24 = (ArenaStringPtr *)"inner_layer";
      if ((uint)local_b0 != 1) {
        pAVar24 = (ArenaStringPtr *)local_98.super_MessageLite._vptr_MessageLite;
      }
      uVar22 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
      puVar23 = (undefined8 *)(uVar22 & 0xfffffffffffffffc);
      if ((uVar22 & 1) != 0) {
        puVar23 = (undefined8 *)*puVar23;
      }
      google::protobuf::internal::ArenaStringPtr::
      Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar13->name_,pAVar24,puVar23)
      ;
      pTVar14 = &local_f0;
      if (uVar7 == 0) {
        pTVar14 = local_a0;
      }
      CoreML::Specification::NeuralNetworkLayer::add_input(pNVar13,pTVar14->name);
      pTVar14 = &local_d0;
      if (uVar7 == local_68) {
        pTVar14 = local_a8;
      }
      CoreML::Specification::NeuralNetworkLayer::add_output(pNVar13,pTVar14->name);
      if (pNVar13->_oneof_case_[0] == 0x8c) {
        LVar15 = pNVar13->layer_;
      }
      else {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar13);
        pNVar13->_oneof_case_[0] = 0x8c;
        uVar22 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
        pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
        if ((uVar22 & 1) != 0) {
          pAVar25 = *(Arena **)pAVar25;
        }
        LVar15.innerproduct_ =
             google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>(pAVar25);
        (pNVar13->layer_).innerproduct_ = (InnerProductLayerParams *)LVar15;
      }
      (LVar15.innerproduct_)->inputchannels_ = 1;
      (LVar15.innerproduct_)->outputchannels_ = 1;
      pWVar16 = (WeightParams *)((LVar15.activation_)->NonlinearityType_).relu_;
      if (pWVar16 == (WeightParams *)0x0) {
        uVar22 = ((LVar15.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
        pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
        if ((uVar22 & 1) != 0) {
          pAVar25 = *(Arena **)pAVar25;
        }
        pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                            (pAVar25);
        ((LVar15.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar16;
      }
      if ((char)local_64 == '\0') {
        pRVar2 = &pWVar16->floatvalue_;
        uVar29 = (((atomic<int> *)&(pWVar16->floatvalue_).current_size_)->super___atomic_base<int>).
                 _M_i;
        if (uVar29 == (pWVar16->floatvalue_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar29 + 1);
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 1.0;
        }
        else {
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 1.0;
        }
        (((atomic<int> *)&pRVar2->current_size_)->super___atomic_base<int>)._M_i = uVar29 + 1;
      }
      else {
        pQVar17 = pWVar16->quantization_;
        if (pQVar17 == (QuantizationParams *)0x0) {
          uVar22 = (pWVar16->super_MessageLite)._internal_metadata_.ptr_;
          pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
          if ((uVar22 & 1) != 0) {
            pAVar25 = *(Arena **)pAVar25;
          }
          pQVar17 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::QuantizationParams>(pAVar25);
          pWVar16->quantization_ = pQVar17;
        }
        pQVar17->numberofbits_ = 1;
        if (pQVar17->_oneof_case_[0] == 0x65) {
          pLVar19 = (pQVar17->QuantizationType_).linearquantization_;
        }
        else {
          CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar17);
          pQVar17->_oneof_case_[0] = 0x65;
          uVar22 = (pQVar17->super_MessageLite)._internal_metadata_.ptr_;
          pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
          if ((uVar22 & 1) != 0) {
            pAVar25 = *(Arena **)pAVar25;
          }
          pLVar19 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::LinearQuantizationParams>(pAVar25);
          (pQVar17->QuantizationType_).linearquantization_ = pLVar19;
        }
        pRVar2 = &pLVar19->scale_;
        uVar29 = (pLVar19->scale_).current_size_;
        if (uVar29 == (pLVar19->scale_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar29 + 1);
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 1.0;
        }
        else {
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 1.0;
        }
        (pLVar19->scale_).current_size_ = uVar29 + 1;
        pRVar2 = &pLVar19->bias_;
        uVar29 = (pLVar19->bias_).current_size_;
        if (uVar29 == (pLVar19->bias_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar29 + 1);
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 0.0;
        }
        else {
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 0.0;
        }
        pRVar2->current_size_ = uVar29 + 1;
        uVar22 = (pWVar16->super_MessageLite)._internal_metadata_.ptr_;
        puVar23 = (undefined8 *)(uVar22 & 0xfffffffffffffffc);
        if ((uVar22 & 1) != 0) {
          puVar23 = (undefined8 *)*puVar23;
        }
        google::protobuf::internal::ArenaStringPtr::
        Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                  (&pWVar16->int8rawvalue_,"x01",puVar23);
      }
      (LVar15.innerproduct_)->hasbias_ = true;
      pWVar16 = (LVar15.innerproduct_)->bias_;
      if (pWVar16 == (WeightParams *)0x0) {
        uVar22 = ((LVar15.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
        pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
        if ((uVar22 & 1) != 0) {
          pAVar25 = *(Arena **)pAVar25;
        }
        pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                            (pAVar25);
        (LVar15.innerproduct_)->bias_ = pWVar16;
      }
      if (isBiasQuantized) {
        pQVar17 = pWVar16->quantization_;
        if (pQVar17 == (QuantizationParams *)0x0) {
          uVar22 = (pWVar16->super_MessageLite)._internal_metadata_.ptr_;
          pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
          if ((uVar22 & 1) != 0) {
            pAVar25 = *(Arena **)pAVar25;
          }
          pQVar17 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::QuantizationParams>(pAVar25);
          pWVar16->quantization_ = pQVar17;
        }
        pQVar17->numberofbits_ = 1;
        if (pQVar17->_oneof_case_[0] == 0x65) {
          pLVar19 = (pQVar17->QuantizationType_).linearquantization_;
        }
        else {
          CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar17);
          pQVar17->_oneof_case_[0] = 0x65;
          uVar22 = (pQVar17->super_MessageLite)._internal_metadata_.ptr_;
          pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
          if ((uVar22 & 1) != 0) {
            pAVar25 = *(Arena **)pAVar25;
          }
          pLVar19 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::LinearQuantizationParams>(pAVar25);
          (pQVar17->QuantizationType_).linearquantization_ = pLVar19;
        }
        pRVar2 = &pLVar19->scale_;
        uVar29 = (pLVar19->scale_).current_size_;
        if (uVar29 == (pLVar19->scale_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar29 + 1);
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 1.0;
        }
        else {
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 1.0;
        }
        (pLVar19->scale_).current_size_ = uVar29 + 1;
        pRVar2 = &pLVar19->bias_;
        uVar29 = (pLVar19->bias_).current_size_;
        if (uVar29 == (pLVar19->bias_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar29 + 1);
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 0.0;
        }
        else {
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 0.0;
        }
        pRVar2->current_size_ = uVar29 + 1;
        uVar22 = (pWVar16->super_MessageLite)._internal_metadata_.ptr_;
        puVar23 = (undefined8 *)(uVar22 & 0xfffffffffffffffc);
        if ((uVar22 & 1) != 0) {
          puVar23 = (undefined8 *)*puVar23;
        }
        google::protobuf::internal::ArenaStringPtr::
        Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                  (&pWVar16->int8rawvalue_,"x01",puVar23);
      }
      else {
        pRVar2 = &pWVar16->floatvalue_;
        uVar29 = (pWVar16->floatvalue_).current_size_;
        if (uVar29 == (pWVar16->floatvalue_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar29 + 1);
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 1.0;
        }
        else {
          pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
          pfVar18[uVar29] = 1.0;
        }
        pRVar2->current_size_ = uVar29 + 1;
      }
      if (isUpdatable) {
        pNVar13->isupdatable_ = true;
        pWVar16 = (WeightParams *)((LVar15.activation_)->NonlinearityType_).linear_;
        if (pWVar16 == (WeightParams *)0x0) {
          uVar22 = ((LVar15.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
          pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
          if ((uVar22 & 1) != 0) {
            pAVar25 = *(Arena **)pAVar25;
          }
          pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                              (pAVar25);
          ((LVar15.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar16;
        }
        pWVar16->isupdatable_ = true;
        pWVar16 = (LVar15.innerproduct_)->bias_;
        if (pWVar16 == (WeightParams *)0x0) {
          uVar22 = ((LVar15.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
          pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
          if ((uVar22 & 1) != 0) {
            pAVar25 = *(Arena **)pAVar25;
          }
          pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                              (pAVar25);
          (LVar15.innerproduct_)->bias_ = pWVar16;
        }
        pWVar16->isupdatable_ = true;
      }
      if ((long *)local_d0.name != &local_c0) {
        operator_delete(local_d0.name,local_c0 + 1);
      }
      if ((long *)local_f0.name != &local_e0) {
        operator_delete(local_f0.name,local_e0 + 1);
      }
      if ((ArenaStringPtr *)local_98.super_MessageLite._vptr_MessageLite != &local_98.name_) {
        operator_delete(local_98.super_MessageLite._vptr_MessageLite,
                        (long)local_98.name_.tagged_ptr_.ptr_ + 1);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)local_b0);
  }
  if (isUpdatable) {
    m->isupdatable_ = true;
    pMVar8 = m->description_;
    if (pMVar8 == (ModelDescription *)0x0) {
      pMVar8 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar3 = (pMVar8->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar32 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar32 = (void **)0x0;
    }
    lVar27 = (long)(pMVar8->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar27 != 0) {
      lVar28 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  (&local_98,*(FeatureDescription **)((long)ppvVar32 + lVar28));
        pMVar8 = m->description_;
        if (pMVar8 == (ModelDescription *)0x0) {
          uVar22 = (m->super_MessageLite)._internal_metadata_.ptr_;
          pAVar25 = (Arena *)(uVar22 & 0xfffffffffffffffc);
          if ((uVar22 & 1) != 0) {
            pAVar25 = *(Arena **)pAVar25;
          }
          pMVar8 = google::protobuf::Arena::
                   CreateMaybeMessage<CoreML::Specification::ModelDescription>(pAVar25);
          m->description_ = pMVar8;
        }
        pRVar3 = (pMVar8->traininginput_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar3 == (Rep *)0x0) {
LAB_001dda47:
          pFVar20 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                              ((pMVar8->traininginput_).super_RepeatedPtrFieldBase.arena_);
          pFVar20 = (FeatureDescription *)
                    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                              (&(pMVar8->traininginput_).super_RepeatedPtrFieldBase,pFVar20);
        }
        else {
          iVar30 = (pMVar8->traininginput_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar3->allocated_size <= iVar30) goto LAB_001dda47;
          (pMVar8->traininginput_).super_RepeatedPtrFieldBase.current_size_ = iVar30 + 1;
          pFVar20 = (FeatureDescription *)pRVar3->elements[iVar30];
        }
        CoreML::Specification::FeatureDescription::CopyFrom(pFVar20,&local_98);
        CoreML::Specification::FeatureDescription::~FeatureDescription(&local_98);
        lVar28 = lVar28 + 8;
      } while (lVar27 * 8 != lVar28);
    }
  }
  return local_60;
}

Assistant:

Specification::NeuralNetwork* buildBasicNeuralNetworkModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, int numberOfLayers, bool areWeightsQuantized, bool isBiasQuantized) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto neuralNet = m.mutable_neuralnetwork();
    
    for (int i = 0; i < numberOfLayers; i++) {
        auto layer = neuralNet->add_layers();
        
        std::string layerName = "inner_layer" + std::to_string(i);
        std::string input = "output" + std::to_string(i-1);
        std::string output = "output" + std::to_string(i);
        
        layer->set_name((numberOfLayers == 1) ? "inner_layer" : layerName.c_str());
        layer->add_input((i == 0) ? inTensorAttr->name : input.c_str());
        layer->add_output((i == numberOfLayers-1) ? outTensorAttr->name : output.c_str());
        
        Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
        innerProductParams->set_inputchannels(1);
        innerProductParams->set_outputchannels(1);

        // set weight
        auto* weights = innerProductParams->mutable_weights();
        if (areWeightsQuantized) {
            auto *quant_params = weights->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            weights->set_int8rawvalue("x01"); // this is [1]
        } else {
            weights->add_floatvalue(1.0);
        }

        // set bias
        innerProductParams->set_hasbias(true);
        auto* bias = innerProductParams->mutable_bias();
        if (isBiasQuantized) {
            auto *quant_params = bias->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            bias->set_int8rawvalue("x01"); // this is [1]
        } else {
            bias->add_floatvalue(1.0);
        }
        
        if (isUpdatable) {
            layer->set_isupdatable(true);
            innerProductParams->mutable_weights()->set_isupdatable(true);
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
    }
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
    }
    
    return neuralNet;
}